

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateElementDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlElementPtr elem)

{
  xmlChar *str2;
  int iVar1;
  xmlChar *name;
  xmlElementContentPtr next;
  xmlElementContentPtr cur;
  xmlChar *prefix;
  xmlChar *localName;
  xmlElementPtr tst;
  xmlNodePtr pxStack_28;
  int ret;
  xmlElementPtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  tst._4_4_ = 1;
  if (doc == (xmlDocPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if (elem == (xmlElementPtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else {
    pxStack_28 = (xmlNodePtr)elem;
    elem_local = (xmlElementPtr)doc;
    doc_local = (xmlDocPtr)ctxt;
    if (elem->etype == XML_ELEMENT_TYPE_MIXED) {
      for (next = elem->content;
          ((next != (xmlElementContentPtr)0x0 && (next->type == XML_ELEMENT_CONTENT_OR)) &&
          (next->c1 != (_xmlElementContent *)0x0)); next = next->c2) {
        if (next->c1->type == XML_ELEMENT_CONTENT_ELEMENT) {
          str2 = next->c1->name;
          for (name = (xmlChar *)next->c2; name != (xmlChar *)0x0; name = *(xmlChar **)(name + 0x18)
              ) {
            if (*(int *)name == 2) {
              iVar1 = xmlStrEqual(*(xmlChar **)(name + 8),str2);
              if ((iVar1 != 0) &&
                 (iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x28),next->c1->prefix), iVar1 != 0)) {
                if (next->c1->prefix == (xmlChar *)0x0) {
                  xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxStack_28,XML_DTD_CONTENT_ERROR,
                                  "Definition of %s has duplicate references of %s\n",
                                  pxStack_28->name,str2,(xmlChar *)0x0);
                }
                else {
                  xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxStack_28,XML_DTD_CONTENT_ERROR,
                                  "Definition of %s has duplicate references of %s:%s\n",
                                  pxStack_28->name,next->c1->prefix,str2);
                }
                tst._4_4_ = 0;
              }
              break;
            }
            if ((*(long *)(name + 0x10) == 0) || (**(int **)(name + 0x10) != 2)) break;
            iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x10) + 8),str2);
            if ((iVar1 != 0) &&
               (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x10) + 0x28),next->c1->prefix),
               iVar1 != 0)) {
              if (next->c1->prefix == (xmlChar *)0x0) {
                xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxStack_28,XML_DTD_CONTENT_ERROR,
                                "Definition of %s has duplicate references to %s\n",pxStack_28->name
                                ,str2,(xmlChar *)0x0);
              }
              else {
                xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxStack_28,XML_DTD_CONTENT_ERROR,
                                "Definition of %s has duplicate references to %s:%s\n",
                                pxStack_28->name,next->c1->prefix,str2);
              }
              tst._4_4_ = 0;
            }
          }
        }
      }
    }
    prefix = xmlSplitQName4(pxStack_28->name,(xmlChar **)&cur);
    if (prefix == (xmlChar *)0x0) {
      xmlVErrMemory((xmlValidCtxtPtr)doc_local);
      ctxt_local._4_4_ = 0;
    }
    else {
      if ((((elem_local->content != (xmlElementContentPtr)0x0) &&
           (localName = (xmlChar *)
                        xmlHashLookup2((xmlHashTablePtr)elem_local->content[1].parent,prefix,
                                       (xmlChar *)cur), (xmlNodePtr)localName != (xmlNodePtr)0x0))
          && ((xmlNodePtr)localName != pxStack_28)) &&
         (((((xmlNodePtr)localName)->nsDef == pxStack_28->nsDef ||
           (iVar1 = xmlStrEqual((xmlChar *)((xmlNodePtr)localName)->nsDef,
                                (xmlChar *)pxStack_28->nsDef), iVar1 != 0)) &&
          (*(int *)(localName + 0x48) != 0)))) {
        xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxStack_28,XML_DTD_ELEM_REDEFINED,
                        "Redefinition of element %s\n",pxStack_28->name,(xmlChar *)0x0,
                        (xmlChar *)0x0);
        tst._4_4_ = 0;
      }
      if (((elem_local->attributes != (xmlAttributePtr)0x0) &&
          (localName = (xmlChar *)
                       xmlHashLookup2(*(xmlHashTablePtr *)&elem_local->attributes->atype,prefix,
                                      (xmlChar *)cur), (xmlNodePtr)localName != (xmlNodePtr)0x0)) &&
         (((xmlNodePtr)localName != pxStack_28 &&
          (((((xmlNodePtr)localName)->nsDef == pxStack_28->nsDef ||
            (iVar1 = xmlStrEqual((xmlChar *)((xmlNodePtr)localName)->nsDef,
                                 (xmlChar *)pxStack_28->nsDef), iVar1 != 0)) &&
           (*(int *)(localName + 0x48) != 0)))))) {
        xmlErrValidNode((xmlValidCtxtPtr)doc_local,pxStack_28,XML_DTD_ELEM_REDEFINED,
                        "Redefinition of element %s\n",pxStack_28->name,(xmlChar *)0x0,
                        (xmlChar *)0x0);
        tst._4_4_ = 0;
      }
      (*xmlFree)(cur);
      ctxt_local._4_4_ = tst._4_4_;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateElementDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlElementPtr elem) {
    int ret = 1;
    xmlElementPtr tst;
    const xmlChar *localName;
    xmlChar *prefix;

    CHECK_DTD;

    if (elem == NULL) return(1);

    /* No Duplicate Types */
    if (elem->etype == XML_ELEMENT_TYPE_MIXED) {
	xmlElementContentPtr cur, next;
        const xmlChar *name;

	cur = elem->content;
	while (cur != NULL) {
	    if (cur->type != XML_ELEMENT_CONTENT_OR) break;
	    if (cur->c1 == NULL) break;
	    if (cur->c1->type == XML_ELEMENT_CONTENT_ELEMENT) {
		name = cur->c1->name;
		next = cur->c2;
		while (next != NULL) {
		    if (next->type == XML_ELEMENT_CONTENT_ELEMENT) {
		        if ((xmlStrEqual(next->name, name)) &&
			    (xmlStrEqual(next->prefix, cur->c1->prefix))) {
			    if (cur->c1->prefix == NULL) {
				xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
		   "Definition of %s has duplicate references of %s\n",
				       elem->name, name, NULL);
			    } else {
				xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
		   "Definition of %s has duplicate references of %s:%s\n",
				       elem->name, cur->c1->prefix, name);
			    }
			    ret = 0;
			}
			break;
		    }
		    if (next->c1 == NULL) break;
		    if (next->c1->type != XML_ELEMENT_CONTENT_ELEMENT) break;
		    if ((xmlStrEqual(next->c1->name, name)) &&
		        (xmlStrEqual(next->c1->prefix, cur->c1->prefix))) {
			if (cur->c1->prefix == NULL) {
			    xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
	       "Definition of %s has duplicate references to %s\n",
				   elem->name, name, NULL);
			} else {
			    xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
	       "Definition of %s has duplicate references to %s:%s\n",
				   elem->name, cur->c1->prefix, name);
			}
			ret = 0;
		    }
		    next = next->c2;
		}
	    }
	    cur = cur->c2;
	}
    }

    localName = xmlSplitQName4(elem->name, &prefix);
    if (localName == NULL) {
        xmlVErrMemory(ctxt);
        return(0);
    }

    /* VC: Unique Element Type Declaration */
    if (doc->intSubset != NULL) {
        tst = xmlHashLookup2(doc->intSubset->elements, localName, prefix);

        if ((tst != NULL ) && (tst != elem) &&
            ((tst->prefix == elem->prefix) ||
             (xmlStrEqual(tst->prefix, elem->prefix))) &&
            (tst->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",
                           elem->name, NULL, NULL);
            ret = 0;
        }
    }
    if (doc->extSubset != NULL) {
        tst = xmlHashLookup2(doc->extSubset->elements, localName, prefix);

        if ((tst != NULL ) && (tst != elem) &&
            ((tst->prefix == elem->prefix) ||
             (xmlStrEqual(tst->prefix, elem->prefix))) &&
            (tst->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",
                           elem->name, NULL, NULL);
            ret = 0;
        }
    }

    /* One ID per Element Type
     * already done when registering the attribute
    if (xmlScanIDAttributeDecl(ctxt, elem) > 1) {
	ret = 0;
    } */

    xmlFree(prefix);
    return(ret);
}